

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_nl.h
# Opt level: O0

void __thiscall
mp::NLConstraint::NLConstraint(NLConstraint *this,LinTerms *lt,int expr,AlgConRange rng,bool fSort)

{
  LinTerms *this_00;
  undefined4 in_EDX;
  long in_RDI;
  undefined8 in_XMM1_Qa;
  LinTerms *in_stack_ffffffffffffff38;
  LinTerms *in_stack_ffffffffffffff40;
  LinTerms *in_stack_ffffffffffffff48;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange> *in_stack_ffffffffffffff50;
  AlgConRange in_stack_ffffffffffffff58;
  
  BasicConstraint::BasicConstraint((BasicConstraint *)0x1ac73c);
  this_00 = (LinTerms *)(in_RDI + 0x20);
  LinTerms::LinTerms(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::AlgebraicConstraint
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff58,
             SUB81((ulong)in_XMM1_Qa >> 0x38,0));
  LinTerms::~LinTerms(this_00);
  *(undefined4 *)(in_RDI + 200) = in_EDX;
  return;
}

Assistant:

NLConstraint(
      const LinTerms& lt, int expr, AlgConRange rng,
      bool fSort=true)
      : lcr_(lt, rng, fSort), expr_(expr) { }